

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DivideTest.h
# Opt level: O2

void __thiscall
DivideTest<unsigned_long>::test_all_algorithms
          (DivideTest<unsigned_long> *this,unsigned_long denom,set_t<unsigned_long> *tested_denom)

{
  iterator iVar1;
  unsigned_long local_20;
  
  local_20 = denom;
  iVar1 = std::
          _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
          ::find(&tested_denom->_M_t,&local_20);
  if (&(tested_denom->_M_t)._M_impl.super__Rb_tree_header == (_Rb_tree_header *)iVar1._M_node) {
    test_many<(libdivide::Branching)0>(this,local_20);
    test_many<(libdivide::Branching)1>(this,local_20);
    std::
    _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
    ::_M_insert_unique<unsigned_long_const&>
              ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                *)tested_denom,&local_20);
  }
  return;
}

Assistant:

void test_all_algorithms(T denom, set_t<T> &tested_denom) {
#if !defined(__AVR__)
        if (tested_denom.end() == tested_denom.find(denom)) {
#endif
            PRINT_PROGRESS_MSG(F("Testing deom "));
            PRINT_PROGRESS_MSG(denom);
            PRINT_PROGRESS_MSG(F("\n"));
            test_many<BRANCHFULL>(denom);
            test_many<BRANCHFREE>(denom);
#if !defined(__AVR__)
            tested_denom.insert(denom);
        }
#else
        UNUSED(tested_denom);
#endif
    }